

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O0

int Abc_ManResubCollectDivs(Abc_ManRes_t *p,Abc_Obj_t *pRoot,Vec_Ptr_t *vLeaves,int Required)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Abc_Obj_t *pAVar7;
  void *pvVar8;
  Abc_Obj_t *p_00;
  Abc_Obj_t *pAVar9;
  int local_50;
  int Counter;
  int Limit;
  int k;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pNode;
  int Required_local;
  Vec_Ptr_t *vLeaves_local;
  Abc_Obj_t *pRoot_local;
  Abc_ManRes_t *p_local;
  
  Vec_PtrClear(p->vDivs1UP);
  Vec_PtrClear(p->vDivs1UN);
  Vec_PtrClear(p->vDivs1B);
  Vec_PtrClear(p->vDivs);
  Abc_NtkIncrementTravId(pRoot->pNtk);
  for (Limit = 0; iVar1 = Vec_PtrSize(vLeaves), Limit < iVar1; Limit = Limit + 1) {
    pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(vLeaves,Limit);
    Vec_PtrPush(p->vDivs,pAVar7);
    Abc_NodeSetTravIdCurrent(pAVar7);
  }
  for (Limit = 0; iVar1 = Vec_PtrSize(p->vTemp), Limit < iVar1; Limit = Limit + 1) {
    pvVar8 = Vec_PtrEntry(p->vTemp,Limit);
    *(uint *)((long)pvVar8 + 0x14) = *(uint *)((long)pvVar8 + 0x14) & 0xffffffef | 0x10;
  }
  Abc_ManResubCollectDivs_rec(pRoot,p->vDivs);
  for (Limit = 0; iVar1 = Vec_PtrSize(p->vTemp), Limit < iVar1; Limit = Limit + 1) {
    pvVar8 = Vec_PtrEntry(p->vTemp,Limit);
    *(uint *)((long)pvVar8 + 0x14) = *(uint *)((long)pvVar8 + 0x14) & 0xffffffef;
  }
  iVar1 = Vec_PtrSize(p->vDivs);
  iVar2 = Vec_PtrSize(vLeaves);
  iVar3 = Vec_PtrSize(p->vTemp);
  iVar4 = Vec_PtrSize(p->vSims);
  if ((iVar1 - iVar2) + iVar3 < iVar4 - p->nLeavesMax) {
    iVar2 = Vec_PtrSize(p->vSims);
    iVar1 = p->nLeavesMax;
    iVar3 = Vec_PtrSize(p->vDivs);
    iVar4 = Vec_PtrSize(vLeaves);
    iVar5 = Vec_PtrSize(p->vTemp);
    local_50 = 0;
    for (Limit = 0; iVar6 = Vec_PtrSize(p->vDivs), Limit < iVar6; Limit = Limit + 1) {
      pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs,Limit);
      iVar6 = Abc_ObjFanoutNum(pAVar7);
      if (iVar6 < 0x65) {
        for (Counter = 0; iVar6 = Abc_ObjFanoutNum(pAVar7), Counter < iVar6; Counter = Counter + 1)
        {
          p_00 = Abc_ObjFanout(pAVar7,Counter);
          iVar6 = Abc_NodeIsTravIdCurrent(p_00);
          if (((iVar6 == 0) && (iVar6 = Abc_ObjIsCo(p_00), iVar6 == 0)) &&
             ((int)(*(uint *)&p_00->field_0x14 >> 0xc) <= Required)) {
            pAVar9 = Abc_ObjFanin0(p_00);
            iVar6 = Abc_NodeIsTravIdCurrent(pAVar9);
            if (iVar6 != 0) {
              pAVar9 = Abc_ObjFanin1(p_00);
              iVar6 = Abc_NodeIsTravIdCurrent(pAVar9);
              if (((iVar6 != 0) && (pAVar9 = Abc_ObjFanin0(p_00), pAVar9 != pRoot)) &&
                 (pAVar9 = Abc_ObjFanin1(p_00), pAVar9 != pRoot)) {
                Vec_PtrPush(p->vDivs,p_00);
                Abc_NodeSetTravIdCurrent(p_00);
                local_50 = local_50 + 1;
                if (local_50 == (iVar2 - iVar1) - ((iVar3 - iVar4) + iVar5)) goto LAB_00366597;
              }
            }
          }
        }
      }
    }
LAB_00366597:
    iVar1 = Vec_PtrSize(p->vDivs);
    p->nDivs = iVar1;
    for (Limit = 0; iVar1 = Vec_PtrSize(p->vTemp), Limit < iVar1; Limit = Limit + 1) {
      pvVar8 = Vec_PtrEntry(p->vTemp,Limit);
      Vec_PtrPush(p->vDivs,pvVar8);
    }
    pAVar7 = (Abc_Obj_t *)Vec_PtrEntryLast(p->vDivs);
    if (pRoot != pAVar7) {
      __assert_fail("pRoot == Vec_PtrEntryLast(p->vDivs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                    ,0x1f5,
                    "int Abc_ManResubCollectDivs(Abc_ManRes_t *, Abc_Obj_t *, Vec_Ptr_t *, int)");
    }
    iVar1 = Vec_PtrSize(p->vDivs);
    iVar2 = Vec_PtrSize(vLeaves);
    iVar3 = Vec_PtrSize(p->vSims);
    if (iVar3 - p->nLeavesMax < iVar1 - iVar2) {
      __assert_fail("Vec_PtrSize(p->vDivs) - Vec_PtrSize(vLeaves) <= Vec_PtrSize(p->vSims) - p->nLeavesMax"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                    ,0x1f7,
                    "int Abc_ManResubCollectDivs(Abc_ManRes_t *, Abc_Obj_t *, Vec_Ptr_t *, int)");
    }
    p_local._4_4_ = 1;
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Abc_ManResubCollectDivs( Abc_ManRes_t * p, Abc_Obj_t * pRoot, Vec_Ptr_t * vLeaves, int Required )
{
    Abc_Obj_t * pNode, * pFanout;
    int i, k, Limit, Counter;

    Vec_PtrClear( p->vDivs1UP );
    Vec_PtrClear( p->vDivs1UN );
    Vec_PtrClear( p->vDivs1B );

    // add the leaves of the cuts to the divisors
    Vec_PtrClear( p->vDivs );
    Abc_NtkIncrementTravId( pRoot->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pNode, i )
    {
        Vec_PtrPush( p->vDivs, pNode );
        Abc_NodeSetTravIdCurrent( pNode );        
    }

    // mark nodes in the MFFC
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vTemp, pNode, i )
        pNode->fMarkA = 1;
    // collect the cone (without MFFC)
    Abc_ManResubCollectDivs_rec( pRoot, p->vDivs );
    // unmark the current MFFC
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vTemp, pNode, i )
        pNode->fMarkA = 0;

    // check if the number of divisors is not exceeded
    if ( Vec_PtrSize(p->vDivs) - Vec_PtrSize(vLeaves) + Vec_PtrSize(p->vTemp) >= Vec_PtrSize(p->vSims) - p->nLeavesMax )
        return 0;

    // get the number of divisors to collect
    Limit = Vec_PtrSize(p->vSims) - p->nLeavesMax - (Vec_PtrSize(p->vDivs) - Vec_PtrSize(vLeaves) + Vec_PtrSize(p->vTemp));

    // explore the fanouts, which are not in the MFFC
    Counter = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs, pNode, i )
    {
        if ( Abc_ObjFanoutNum(pNode) > 100 )
        {
//            printf( "%d ", Abc_ObjFanoutNum(pNode) );
            continue;
        }
        // if the fanout has both fanins in the set, add it
        Abc_ObjForEachFanout( pNode, pFanout, k )
        {
            if ( Abc_NodeIsTravIdCurrent(pFanout) || Abc_ObjIsCo(pFanout) || (int)pFanout->Level > Required )
                continue;
            if ( Abc_NodeIsTravIdCurrent(Abc_ObjFanin0(pFanout)) && Abc_NodeIsTravIdCurrent(Abc_ObjFanin1(pFanout)) )
            {
                if ( Abc_ObjFanin0(pFanout) == pRoot || Abc_ObjFanin1(pFanout) == pRoot )
                    continue;
                Vec_PtrPush( p->vDivs, pFanout );
                Abc_NodeSetTravIdCurrent( pFanout );
                // quit computing divisors if there is too many of them
                if ( ++Counter == Limit )
                    goto Quits;
            }
        }
    }

Quits :
    // get the number of divisors
    p->nDivs = Vec_PtrSize(p->vDivs);

    // add the nodes in the MFFC
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vTemp, pNode, i )
        Vec_PtrPush( p->vDivs, pNode );
    assert( pRoot == Vec_PtrEntryLast(p->vDivs) );

    assert( Vec_PtrSize(p->vDivs) - Vec_PtrSize(vLeaves) <= Vec_PtrSize(p->vSims) - p->nLeavesMax );
    return 1;
}